

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpaqueInstancePath.cpp
# Opt level: O1

void __thiscall slang::ast::OpaqueInstancePath::buildPath(OpaqueInstancePath *this,Symbol *symbol)

{
  SymbolKind SVar1;
  SyntaxNode *pSVar2;
  size_t sVar3;
  long lVar4;
  uint uVar5;
  Scope *pSVar6;
  long lVar7;
  Entry local_40;
  SyntaxNode *local_38;
  
  pSVar6 = Symbol::getHierarchicalParent(symbol);
  if ((symbol->kind == CheckerInstanceBody) || (symbol->kind == InstanceBody)) {
    symbol = (Symbol *)symbol[1].originatingSyntax;
  }
  pSVar2 = symbol->originatingSyntax;
  if (pSVar6 != (Scope *)0x0) {
    uVar5 = pSVar6->thisSym->kind - InstanceBody;
    if ((uVar5 < 0x28) && ((0x8000000183U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
      buildPath(this,pSVar6->thisSym);
    }
  }
  SVar1 = symbol->kind;
  local_40.value = (uintptr_t)pSVar2;
  if ((SVar1 == Instance) || (SVar1 == CheckerInstance)) {
    sVar3 = symbol[1].name._M_len;
    if (sVar3 == 0) {
      if (pSVar2 == (SyntaxNode *)0x0) {
        local_40.value = (uintptr_t)*(SyntaxNode **)(symbol[1].name._M_str + 0x38);
      }
    }
    else {
      lVar4 = *(long *)(symbol + 1);
      lVar7 = 0;
      local_38 = pSVar2;
      do {
        local_40.value = (uintptr_t)*(uint *)(lVar4 + lVar7);
        SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>::
        emplace_back<slang::ast::OpaqueInstancePath::Entry>
                  ((SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *)this,&local_40);
        lVar7 = lVar7 + 4;
        local_40.value = (uintptr_t)local_38;
      } while (sVar3 * 4 - lVar7 != 0);
    }
    if (sVar3 != 0) {
      return;
    }
  }
  else if (SVar1 == GenerateBlock) {
    if ((pSVar6 != (Scope *)0x0) && (pSVar6->thisSym->kind == GenerateBlockArray)) {
      local_40.value = (uintptr_t)(ulong)*(uint *)&symbol[1].originatingSyntax;
    }
  }
  else if ((SVar1 == InstanceArray && pSVar6 != (Scope *)0x0) &&
          (pSVar6->thisSym->kind == InstanceArray)) {
    return;
  }
  SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>::
  emplace_back<slang::ast::OpaqueInstancePath::Entry>
            ((SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *)this,&local_40);
  return;
}

Assistant:

void OpaqueInstancePath::buildPath(const Symbol& symbol) {
    auto scope = symbol.getHierarchicalParent();
    const Symbol* current;
    if (symbol.kind == SymbolKind::InstanceBody)
        current = symbol.as<InstanceBodySymbol>().parentInstance;
    else if (symbol.kind == SymbolKind::CheckerInstanceBody)
        current = symbol.as<CheckerInstanceBodySymbol>().parentInstance;
    else
        current = &symbol;

    SLANG_ASSERT(current);
    auto syntax = current->getSyntax();

    if (scope) {
        auto& parent = scope->asSymbol();
        if (parent.kind == SymbolKind::InstanceBody || parent.kind == SymbolKind::InstanceArray ||
            parent.kind == SymbolKind::CheckerInstance ||
            parent.kind == SymbolKind::GenerateBlock ||
            parent.kind == SymbolKind::GenerateBlockArray) {
            buildPath(parent);
        }
    }

    if (current->kind == SymbolKind::GenerateBlock) {
        if (scope && scope->asSymbol().kind == SymbolKind::GenerateBlockArray) {
            entries.push_back(current->as<GenerateBlockSymbol>().constructIndex);
            return;
        }
    }
    else if (current->kind == SymbolKind::Instance ||
             current->kind == SymbolKind::CheckerInstance) {
        auto& inst = current->as<InstanceSymbolBase>();
        if (!inst.arrayPath.empty()) {
            for (auto idx : inst.arrayPath)
                entries.push_back(idx);
            return;
        }

        if (!syntax) {
            if (current->kind == SymbolKind::Instance)
                syntax = current->as<InstanceSymbol>().body.getSyntax();
            else
                syntax = current->as<CheckerInstanceSymbol>().body.getSyntax();
        }
    }
    else if (current->kind == SymbolKind::InstanceArray) {
        if (scope && scope->asSymbol().kind == SymbolKind::InstanceArray)
            return;
    }

    SLANG_ASSERT(syntax);
    entries.push_back(*syntax);
}